

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int accessPayloadChecked(BtCursor *pCur,u32 offset,u32 amt,void *pBuf)

{
  int local_30;
  int rc;
  void *pBuf_local;
  u32 amt_local;
  u32 offset_local;
  BtCursor *pCur_local;
  
  if (pCur->eState == '\0') {
    pCur_local._4_4_ = 4;
  }
  else {
    local_30 = btreeRestoreCursorPosition(pCur);
    if (local_30 == 0) {
      local_30 = accessPayload(pCur,offset,amt,(uchar *)pBuf,0);
    }
    pCur_local._4_4_ = local_30;
  }
  return pCur_local._4_4_;
}

Assistant:

static SQLITE_NOINLINE int accessPayloadChecked(
  BtCursor *pCur,
  u32 offset,
  u32 amt,
  void *pBuf
){
  int rc;
  if ( pCur->eState==CURSOR_INVALID ){
    return SQLITE_ABORT;
  }
  assert( cursorOwnsBtShared(pCur) );
  rc = btreeRestoreCursorPosition(pCur);
  return rc ? rc : accessPayload(pCur, offset, amt, pBuf, 0);
}